

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::CreateShader::exec(CreateShader *this,Thread *t)

{
  uint uVar1;
  deUint32 err;
  MessageBuilder *pMVar2;
  Shader *pSVar3;
  MessageBuilder local_358;
  MessageBuilder local_1b8;
  uint local_24;
  Thread *pTStack_20;
  GLuint shader;
  EGLThread *thread;
  Thread *t_local;
  CreateShader *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  pTStack_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0)
  ;
  if (pTStack_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  local_24 = 0;
  tcu::ThreadUtil::Thread::newMessage(&local_1b8,pTStack_20);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [25])"Begin -- glCreateShader(");
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,&this->m_type);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b8);
  local_24 = (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0x3f0))(this->m_type);
  err = (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0x800))();
  glu::checkError(err,"glCreateShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                  ,0x552);
  tcu::ThreadUtil::Thread::newMessage(&local_358,pTStack_20);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_358,(char (*) [8])"End -- ");
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,&local_24);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,(char (*) [19])" = glCreateShader(");
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,&this->m_type);
  pMVar2 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar2,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_358);
  uVar1 = local_24;
  pSVar3 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
  pSVar3->shader = uVar1;
  return;
}

Assistant:

void CreateShader::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint shader = 0;

	thread.newMessage() << "Begin -- glCreateShader(" << m_type << ")" << tcu::ThreadUtil::Message::End;
	shader = thread.gl.createShader(m_type);
	GLU_CHECK_GLW_MSG(thread.gl, "glCreateShader()");
	thread.newMessage() << "End -- " << shader  << " = glCreateShader(" << m_type << ")" << tcu::ThreadUtil::Message::End;

	m_shader->shader	= shader;
}